

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  undefined8 *puVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  long *plVar5;
  ostream *poVar6;
  stringstream *this_00;
  size_t sVar7;
  undefined8 *puVar8;
  long *plVar9;
  ulong *puVar10;
  size_type *psVar11;
  _Alloc_hider _Var12;
  ulong uVar13;
  undefined8 uVar14;
  string *this_01;
  uint uVar15;
  char flag;
  char buffer [256];
  byte local_221;
  string local_220;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0;
  long lStack_1c8;
  long *local_1c0;
  long local_1b8;
  long local_1b0;
  long lStack_1a8;
  int local_19c;
  string local_198;
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  string local_138 [8];
  
LAB_0012fde9:
  sVar3 = read(this->read_fd_,&local_221,1);
  iVar2 = (int)sVar3;
  if (iVar2 == -1) goto code_r0x0012fe02;
  if (iVar2 == 0) {
    this->outcome_ = DIED;
    goto LAB_0012fee0;
  }
  if (iVar2 == 1) {
    if (local_221 < 0x52) {
      if (local_221 == 0x49) {
        iVar2 = this->read_fd_;
        this_00 = (stringstream *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream(this_00);
        *(undefined8 *)(this_00 + *(long *)(*(long *)(this_00 + 0x10) + -0x18) + 0x18) = 0x11;
        do {
          while( true ) {
            sVar3 = read(iVar2,local_138,0xff);
            uVar15 = (uint)sVar3;
            if ((int)uVar15 < 1) break;
            *(undefined1 *)((long)&local_138[0]._M_dataplus._M_p + (ulong)(uVar15 & 0x7fffffff)) = 0
            ;
            sVar7 = strlen((char *)local_138);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(this_00 + 0x10),(char *)local_138,sVar7);
          }
        } while ((uVar15 == 0xffffffff) && (piVar4 = __errno_location(), *piVar4 == 4));
        if (uVar15 == 0) {
          GTestLog::GTestLog((GTestLog *)&local_1c0,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/third_party/gtest/googletest/src/gtest-death-test.cc"
                             ,0x14c);
          StringStreamToString(&local_220,(stringstream *)this_00);
          poVar6 = (ostream *)&std::cerr;
          _Var12._M_p = local_220._M_dataplus._M_p;
        }
        else {
          piVar4 = __errno_location();
          iVar2 = *piVar4;
          GTestLog::GTestLog((GTestLog *)&local_1c0,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/third_party/gtest/googletest/src/gtest-death-test.cc"
                             ,0x14f);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error while reading death test internal: ",0x29);
          GetLastErrnoDescription_abi_cxx11_();
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_220._M_dataplus._M_p,
                              local_220._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar2);
          local_220._M_string_length = 1;
          _Var12._M_p = "]";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,_Var12._M_p,local_220._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p);
        }
        GTestLog::~GTestLog((GTestLog *)&local_1c0);
        (**(code **)(*(long *)this_00 + 8))(this_00);
      }
      else {
        if (local_221 != 0x4c) goto LAB_0012ff8f;
        this->outcome_ = LIVED;
      }
      goto LAB_0012fee0;
    }
    if (local_221 == 0x54) {
      this->outcome_ = THREW;
      goto LAB_0012fee0;
    }
    if (local_221 == 0x52) {
      this->outcome_ = RETURNED;
      goto LAB_0012fee0;
    }
LAB_0012ff8f:
    this_01 = local_138;
    GTestLog::GTestLog((GTestLog *)this_01,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/third_party/gtest/googletest/src/gtest-death-test.cc"
                       ,0x1cd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Death test child process reported ",0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"unexpected status byte (",0x18);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    goto LAB_0012fedb;
  }
  goto LAB_0012fe6c;
code_r0x0012fe02:
  piVar4 = __errno_location();
  if (*piVar4 != 4) goto LAB_0012fe6c;
  goto LAB_0012fde9;
LAB_0012fe6c:
  GTestLog::GTestLog((GTestLog *)&local_220,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/third_party/gtest/googletest/src/gtest-death-test.cc"
                     ,0x1d2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Read from death test child process failed: ",0x2b);
  GetLastErrnoDescription_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,local_138[0]._M_dataplus._M_p,local_138[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
    operator_delete(local_138[0]._M_dataplus._M_p);
  }
  this_01 = &local_220;
LAB_0012fedb:
  GTestLog::~GTestLog((GTestLog *)this_01);
LAB_0012fee0:
  do {
    iVar2 = close(this->read_fd_);
    if (iVar2 != -1) {
      this->read_fd_ = -1;
      return;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CHECK failed: File ","");
  plVar5 = (long *)std::__cxx11::string::append((char *)local_158);
  local_178 = (long *)*plVar5;
  plVar9 = plVar5 + 2;
  if (local_178 == plVar9) {
    local_168 = *plVar9;
    lStack_160 = plVar5[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *plVar9;
  }
  local_170 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_178);
  local_1e0 = (ulong *)*plVar5;
  puVar10 = (ulong *)(plVar5 + 2);
  if (local_1e0 == puVar10) {
    local_1d0 = *puVar10;
    lStack_1c8 = plVar5[3];
    local_1e0 = &local_1d0;
  }
  else {
    local_1d0 = *puVar10;
  }
  local_1d8 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_19c = 0x1d5;
  StreamableToString<int>(&local_198,&local_19c);
  uVar13 = 0xf;
  if (local_1e0 != &local_1d0) {
    uVar13 = local_1d0;
  }
  if (uVar13 < local_198._M_string_length + local_1d8) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      uVar14 = local_198.field_2._M_allocated_capacity;
    }
    if (local_198._M_string_length + local_1d8 <= (ulong)uVar14) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_1e0);
      goto LAB_001302a4;
    }
  }
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_198._M_dataplus._M_p);
LAB_001302a4:
  local_200 = (undefined8 *)*puVar8;
  puVar1 = puVar8 + 2;
  if (local_200 == puVar1) {
    local_1f0 = *puVar1;
    uStack_1e8 = puVar8[3];
    local_200 = &local_1f0;
  }
  else {
    local_1f0 = *puVar1;
  }
  local_1f8 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_200);
  local_1c0 = (long *)*plVar5;
  plVar9 = plVar5 + 2;
  if (local_1c0 == plVar9) {
    local_1b0 = *plVar9;
    lStack_1a8 = plVar5[3];
    local_1c0 = &local_1b0;
  }
  else {
    local_1b0 = *plVar9;
  }
  local_1b8 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  local_220._M_dataplus._M_p = (pointer)*plVar5;
  psVar11 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_220._M_dataplus._M_p == psVar11) {
    local_220.field_2._M_allocated_capacity = *psVar11;
    local_220.field_2._8_8_ = plVar5[3];
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar11;
  }
  local_220._M_string_length = plVar5[1];
  *plVar5 = (long)psVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_220);
  local_138[0]._M_dataplus._M_p = (pointer)*plVar5;
  psVar11 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_138[0]._M_dataplus._M_p == psVar11) {
    local_138[0].field_2._0_8_ = *psVar11;
    local_138[0].field_2._8_8_ = plVar5[3];
    local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
  }
  else {
    local_138[0].field_2._0_8_ = *psVar11;
  }
  local_138[0]._M_string_length = plVar5[1];
  *plVar5 = (long)psVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  DeathTestAbort(local_138);
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}